

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.cpp
# Opt level: O0

size_t __thiscall llvm::StringRef::find(StringRef *this,StringRef Str,size_t From)

{
  byte bVar1;
  int iVar2;
  char *__n;
  void *pvVar3;
  char *pcVar4;
  char *__n_00;
  StringRef *__s2;
  size_t local_190;
  uint local_17c;
  byte local_178 [3];
  uint8_t Last;
  uint i;
  uint8_t BadCharSkip [256];
  char *Stop;
  char *Ptr;
  size_t N;
  char *Needle;
  size_t Size;
  char *Start;
  size_t From_local;
  StringRef *this_local;
  StringRef Str_local;
  
  __n_00 = (char *)Str.Length;
  __s2 = (StringRef *)Str.Data;
  if (this->Length < From) {
    Str_local.Length = 0xffffffffffffffff;
  }
  else {
    Size = (size_t)(this->Data + From);
    __n = (char *)(this->Length - From);
    Str_local.Length = From;
    if (__n_00 != (char *)0x0) {
      if (__n < __n_00) {
        Str_local.Length = 0xffffffffffffffff;
      }
      else {
        this_local = __s2;
        Str_local.Data = __n_00;
        if (__n_00 == (char *)0x1) {
          pvVar3 = memchr((void *)Size,(int)*(char *)&__s2->Data,(size_t)__n);
          if (pvVar3 == (void *)0x0) {
            local_190 = 0xffffffffffffffff;
          }
          else {
            local_190 = (long)pvVar3 - (long)this->Data;
          }
          Str_local.Length = local_190;
        }
        else {
          pcVar4 = (char *)(Size + (long)(__n + (1 - (long)__n_00)));
          if ((__n < (char *)0x10) || ((char *)0xff < __n_00)) {
            do {
              iVar2 = memcmp((void *)Size,__s2,(size_t)__n_00);
              if (iVar2 == 0) {
                return Size - (long)this->Data;
              }
              Size = Size + 1;
            } while (Size < pcVar4);
            Str_local.Length = 0xffffffffffffffff;
          }
          else {
            memset(local_178,(uint)Str.Length & 0xff,0x100);
            for (local_17c = 0; (char *)(ulong)local_17c != __n_00 + -1; local_17c = local_17c + 1)
            {
              bVar1 = operator[]((StringRef *)&this_local,(ulong)local_17c);
              local_178[bVar1] = ((char)Str.Length + -1) - (char)local_17c;
            }
            do {
              bVar1 = __n_00[Size - 1];
              if ((bVar1 == (__n_00 + -1)[(long)&__s2->Data]) &&
                 (iVar2 = memcmp((void *)Size,__s2,(size_t)(__n_00 + -1)), iVar2 == 0)) {
                return Size - (long)this->Data;
              }
              Size = Size + (long)(int)(uint)local_178[bVar1];
            } while (Size < pcVar4);
            Str_local.Length = 0xffffffffffffffff;
          }
        }
      }
    }
  }
  return Str_local.Length;
}

Assistant:

size_t StringRef::find(StringRef Str, size_t From) const {
  if (From > Length)
    return npos;

  const char *Start = Data + From;
  size_t Size = Length - From;

  const char *Needle = Str.data();
  size_t N = Str.size();
  if (N == 0)
    return From;
  if (Size < N)
    return npos;
  if (N == 1) {
    const char *Ptr = (const char *)::memchr(Start, Needle[0], Size);
    return Ptr == nullptr ? npos : Ptr - Data;
  }

  const char *Stop = Start + (Size - N + 1);

  // For short haystacks or unsupported needles fall back to the naive algorithm
  if (Size < 16 || N > 255) {
    do {
      if (std::memcmp(Start, Needle, N) == 0)
        return Start - Data;
      ++Start;
    } while (Start < Stop);
    return npos;
  }

  // Build the bad char heuristic table, with uint8_t to reduce cache thrashing.
  uint8_t BadCharSkip[256];
  std::memset(BadCharSkip, N, 256);
  for (unsigned i = 0; i != N-1; ++i)
    BadCharSkip[(uint8_t)Str[i]] = N-1-i;

  do {
    uint8_t Last = Start[N - 1];
    if (LLVM_UNLIKELY(Last == (uint8_t)Needle[N - 1]))
      if (std::memcmp(Start, Needle, N - 1) == 0)
        return Start - Data;

    // Otherwise skip the appropriate number of bytes.
    Start += BadCharSkip[Last];
  } while (Start < Stop);

  return npos;
}